

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_source_generator_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::SourceGeneratorBase::class_access_level_abi_cxx11_
          (string *__return_storage_ptr__,SourceGeneratorBase *this)

{
  bool bVar1;
  Options *pOVar2;
  char *pcVar3;
  byte local_2d;
  allocator local_19;
  SourceGeneratorBase *local_18;
  SourceGeneratorBase *this_local;
  
  local_18 = this;
  this_local = (SourceGeneratorBase *)__return_storage_ptr__;
  bVar1 = IsDescriptorProto(this->descriptor_);
  local_2d = 1;
  if (!bVar1) {
    pOVar2 = options(this);
    local_2d = pOVar2->internal_access;
  }
  pcVar3 = "public";
  if ((local_2d & 1) != 0) {
    pcVar3 = "internal";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceGeneratorBase::class_access_level() {
  return (IsDescriptorProto(descriptor_) || this->options()->internal_access) ? "internal" : "public";
}